

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

void __thiscall
llvm::
DenseMapIterator<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>,_false>
::AdvancePastEmptyBuckets
          (DenseMapIterator<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>,_false>
           *this)

{
  bool bVar1;
  StringRef *pSVar2;
  StringRef RHS;
  StringRef RHS_00;
  bool local_7a;
  bool local_79;
  StringRef Tombstone;
  StringRef Empty;
  DenseMapIterator<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>,_false>
  *this_local;
  
  if (this->Ptr <= this->End) {
    RHS = DenseMapInfo<llvm::StringRef>::getEmptyKey();
    RHS_00 = DenseMapInfo<llvm::StringRef>::getTombstoneKey();
    while( true ) {
      local_79 = false;
      if (this->Ptr != this->End) {
        pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(this->Ptr);
        bVar1 = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar2,RHS);
        local_7a = true;
        if (!bVar1) {
          pSVar2 = detail::DenseSetPair<llvm::StringRef>::getFirst(this->Ptr);
          local_7a = DenseMapInfo<llvm::StringRef>::isEqual(*pSVar2,RHS_00);
        }
        local_79 = local_7a;
      }
      if (local_79 == false) break;
      this->Ptr = this->Ptr + 1;
    }
    return;
  }
  __assert_fail("Ptr <= End",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                ,0x4ad,
                "void llvm::DenseMapIterator<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::AdvancePastEmptyBuckets() [KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, Bucket = llvm::detail::DenseSetPair<llvm::StringRef>, IsConst = false]"
               );
}

Assistant:

void AdvancePastEmptyBuckets() {
    assert(Ptr <= End);
    const KeyT Empty = KeyInfoT::getEmptyKey();
    const KeyT Tombstone = KeyInfoT::getTombstoneKey();

    while (Ptr != End && (KeyInfoT::isEqual(Ptr->getFirst(), Empty) ||
                          KeyInfoT::isEqual(Ptr->getFirst(), Tombstone)))
      ++Ptr;
  }